

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_body.hpp
# Opt level: O0

void iutest::Test::RecordProperty<int>(string *key,int *value)

{
  string local_38;
  int *local_18;
  int *value_local;
  string *key_local;
  
  local_18 = value;
  value_local = (int *)key;
  PrintToString<int>(&local_38,value);
  RecordPropertyString(key,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

static void RecordProperty(const ::std::string& key, const T& value)
    {
        RecordPropertyString(key, PrintToString(value));
    }